

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall
Assimp::FBX::Node::AddChild<aiMatrix4x4t<float>>(Node *this,string *name,aiMatrix4x4t<float> more)

{
  undefined1 local_88 [8];
  Node c;
  string *name_local;
  Node *this_local;
  
  c.property_start = (size_t)name;
  Node((Node *)local_88,name);
  AddProperties<aiMatrix4x4t<float>>((Node *)local_88,more);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,(value_type *)local_88);
  ~Node((Node *)local_88);
  return;
}

Assistant:

void AddChild(
        const std::string& name,
        More... more
    ) {
        FBX::Node c(name);
        c.AddProperties(more...);
        children.push_back(c);
    }